

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phone_loop_search.c
# Opt level: O0

int phone_loop_search_reinit(ps_search_t *search,dict_t *dict,dict2pid_t *d2p)

{
  cmd_ln_t *config_00;
  acmod_t *paVar1;
  logmath_t *plVar2;
  int iVar3;
  hmm_context_t *phVar4;
  long lVar5;
  acmod_t *paVar6;
  ps_search_t *ppVar7;
  ps_searchfuncs_t *ppVar8;
  dict_t *pdVar9;
  double dVar10;
  int local_44;
  int i;
  acmod_t *acmod;
  cmd_ln_t *config;
  phone_loop_search_t *pls;
  dict2pid_t *d2p_local;
  dict_t *dict_local;
  ps_search_t *search_local;
  
  config_00 = search->config;
  paVar1 = search->acmod;
  ps_search_base_reinit(search,dict,d2p);
  if (search[1].type != (char *)0x0) {
    hmm_context_free((hmm_context_t *)search[1].type);
  }
  phVar4 = hmm_context_init(paVar1->mdef->n_emit_state,paVar1->tmat->tp,(int16 *)0x0,
                            paVar1->mdef->sseq);
  search[1].type = (char *)phVar4;
  if (search[1].type == (char *)0x0) {
    search_local._4_4_ = -1;
  }
  else {
    *(short *)((long)&search[1].name + 2) = (short)paVar1->mdef->n_ciphone;
    lVar5 = ps_config_int(config_00,"pl_window");
    *(int *)&search[1].dag = (int)lVar5;
    if (search[1].acmod != (acmod_t *)0x0) {
      ckd_free(search[1].acmod);
    }
    paVar6 = (acmod_t *)
             __ckd_calloc__((long)*(short *)((long)&search[1].name + 2),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/phone_loop_search.c"
                            ,0x5b);
    search[1].acmod = paVar6;
    if (search[1].pls != (ps_search_t *)0x0) {
      ckd_free_2d(search[1].pls);
    }
    ppVar7 = (ps_search_t *)
             __ckd_calloc_2d__((long)*(int *)&search[1].dag,
                               (long)*(short *)((long)&search[1].name + 2),4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/phone_loop_search.c"
                               ,0x5e);
    search[1].pls = ppVar7;
    if (search[1].vt != (ps_searchfuncs_t *)0x0) {
      for (local_44 = 0; local_44 < *(short *)((long)&search[1].name + 2); local_44 = local_44 + 1)
      {
        hmm_deinit((hmm_t *)((long)search[1].vt + (long)local_44 * 0x58));
      }
      ckd_free(search[1].vt);
    }
    ppVar8 = (ps_searchfuncs_t *)
             __ckd_calloc__((long)*(short *)((long)&search[1].name + 2),0x58,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/phone_loop_search.c"
                            ,0x66);
    search[1].vt = ppVar8;
    for (local_44 = 0; local_44 < *(short *)((long)&search[1].name + 2); local_44 = local_44 + 1) {
      hmm_init((hmm_context_t *)search[1].type,(hmm_t *)((long)search[1].vt + (long)local_44 * 0x58)
               ,0,paVar1->mdef->phone[local_44].ssid,paVar1->mdef->phone[local_44].tmat);
    }
    pdVar9 = (dict_t *)ps_config_float(config_00,"pl_weight");
    search[1].dict = pdVar9;
    plVar2 = paVar1->lmath;
    dVar10 = ps_config_float(config_00,"pl_beam");
    iVar3 = logmath_log(plVar2,(float64)dVar10);
    *(int *)((long)&search[1].d2p + 4) = iVar3 >> 10;
    plVar2 = paVar1->lmath;
    dVar10 = ps_config_float(config_00,"pl_pbeam");
    iVar3 = logmath_log(plVar2,(float64)dVar10);
    *(int *)&search[1].hyp_str = iVar3 >> 10;
    plVar2 = paVar1->lmath;
    dVar10 = ps_config_float(config_00,"pl_pip");
    iVar3 = logmath_log(plVar2,(float64)dVar10);
    *(int *)((long)&search[1].hyp_str + 4) = iVar3 >> 10;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/phone_loop_search.c"
            ,0x72,"State beam %d Phone exit beam %d Insertion penalty %d\n",
            (ulong)*(uint *)((long)&search[1].d2p + 4),(ulong)*(uint *)&search[1].hyp_str,
            *(undefined4 *)((long)&search[1].hyp_str + 4));
    search_local._4_4_ = 0;
  }
  return search_local._4_4_;
}

Assistant:

static int
phone_loop_search_reinit(ps_search_t *search, dict_t *dict, dict2pid_t *d2p)
{
    phone_loop_search_t *pls = (phone_loop_search_t *)search;
    cmd_ln_t *config = ps_search_config(search);
    acmod_t *acmod = ps_search_acmod(search);
    int i;

    /* Free old dict2pid, dict, if necessary. */
    ps_search_base_reinit(search, dict, d2p);

    /* Initialize HMM context. */
    if (pls->hmmctx)
        hmm_context_free(pls->hmmctx);
    pls->hmmctx = hmm_context_init(bin_mdef_n_emit_state(acmod->mdef),
                                   acmod->tmat->tp, NULL, acmod->mdef->sseq);
    if (pls->hmmctx == NULL)
        return -1;

    /* Initialize penalty storage */
    pls->n_phones = bin_mdef_n_ciphone(acmod->mdef);
    pls->window = ps_config_int(config, "pl_window");
    if (pls->penalties)
        ckd_free(pls->penalties);
    pls->penalties = (int32 *)ckd_calloc(pls->n_phones, sizeof(*pls->penalties));
    if (pls->pen_buf)
        ckd_free_2d(pls->pen_buf);
    pls->pen_buf = (int32 **)ckd_calloc_2d(pls->window, pls->n_phones, sizeof(**pls->pen_buf));

    /* Initialize phone HMMs. */
    if (pls->hmms) {
        for (i = 0; i < pls->n_phones; ++i)
            hmm_deinit((hmm_t *)&pls->hmms[i]);
        ckd_free(pls->hmms);
    }
    pls->hmms = (hmm_t *)ckd_calloc(pls->n_phones, sizeof(*pls->hmms));
    for (i = 0; i < pls->n_phones; ++i) {
        hmm_init(pls->hmmctx, (hmm_t *)&pls->hmms[i],
                 FALSE,
                 bin_mdef_pid2ssid(acmod->mdef, i),
                 bin_mdef_pid2tmatid(acmod->mdef, i));
    }
    pls->penalty_weight = ps_config_float(config, "pl_weight");
    pls->beam = logmath_log(acmod->lmath, ps_config_float(config, "pl_beam")) >> SENSCR_SHIFT;
    pls->pbeam = logmath_log(acmod->lmath, ps_config_float(config, "pl_pbeam")) >> SENSCR_SHIFT;
    pls->pip = logmath_log(acmod->lmath, ps_config_float(config, "pl_pip")) >> SENSCR_SHIFT;
    E_INFO("State beam %d Phone exit beam %d Insertion penalty %d\n",
           pls->beam, pls->pbeam, pls->pip);

    return 0;
}